

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

shared_ptr<helics::ValueFederate> getValueFedSharedPtr(HelicsFederate fed,HelicsError *err)

{
  bool bVar1;
  FedObject *pFVar2;
  HelicsError *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  element_type *in_RDI;
  shared_ptr<helics::ValueFederate> sVar4;
  FedObject *fedObj;
  shared_ptr<helics::ValueFederate> *rval;
  element_type *this;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar6;
  
  this = in_RDI;
  pFVar2 = helics::getFedObject
                     ((HelicsFederate)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      (HelicsError *)in_RDI);
  if (pFVar2 == (FedObject *)0x0) {
    std::shared_ptr<helics::ValueFederate>::shared_ptr
              ((shared_ptr<helics::ValueFederate> *)this,in_RDI);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    if (((pFVar2->type == VALUE) || (pFVar2->type == COMBINATION)) || (pFVar2->type == CALLBACK)) {
      uVar6 = 0;
      std::dynamic_pointer_cast<helics::ValueFederate,helics::Federate>
                ((shared_ptr<helics::Federate> *)in_RDX);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
      if (bVar1) {
        uVar6 = 0x1000000;
      }
      uVar5 = (uint)bVar1;
      _Var3._M_pi = extraout_RDX_00;
      if ((uVar6 & 0x1000000) == 0) {
        std::shared_ptr<helics::ValueFederate>::~shared_ptr
                  ((shared_ptr<helics::ValueFederate> *)0x1b7ac8);
        _Var3._M_pi = extraout_RDX_01;
      }
      if (uVar5 != 0) goto LAB_001b7af9;
    }
    assignError(in_RDX,-3,"Federate must be a value federate");
    std::shared_ptr<helics::ValueFederate>::shared_ptr
              ((shared_ptr<helics::ValueFederate> *)this,in_RDI);
    _Var3._M_pi = extraout_RDX_02;
  }
LAB_001b7af9:
  sVar4.super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<helics::ValueFederate>)
         sVar4.super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helics::ValueFederate> getValueFedSharedPtr(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = helics::getFedObject(fed, err);
    if (fedObj == nullptr) {
        return nullptr;
    }
    if ((fedObj->type == helics::FederateType::VALUE) || (fedObj->type == helics::FederateType::COMBINATION) ||
        (fedObj->type == helics::FederateType::CALLBACK)) {
        auto rval = std::dynamic_pointer_cast<helics::ValueFederate>(fedObj->fedptr);
        if (rval) {
            return rval;
        }
    }
    assignError(err, HELICS_ERROR_INVALID_OBJECT, notValueFedString);
    return nullptr;
}